

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O1

void __thiscall
CmdLineArgsParser::ParsePhase(CmdLineArgsParser *this,Phases *pPhaseList,Phases *oppositePhase)

{
  LPWSTR pWVar1;
  bool bVar2;
  Phase phase;
  Range *oppositeRange;
  SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount> *this_00;
  Range *pRange;
  undefined8 *puVar3;
  WCHAR local_428 [4];
  char16 buffer [512];
  
  memset(local_428,0,0x400);
  ParseString(this,local_428,0x200,true);
  phase = Js::ConfigFlagsTable::GetPhase(local_428);
  if (phase == InvalidPhase) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = L"Invalid phase :";
    __cxa_throw(puVar3,&Exception::typeinfo,0);
  }
  Js::Phases::Enable(pPhaseList,phase);
  pWVar1 = this->pszCurrentArg;
  if (*pWVar1 != L',') {
    if (*pWVar1 == L':') {
      this->pszCurrentArg = pWVar1 + 1;
      if ((oppositePhase == (Phases *)0x0) ||
         (bVar2 = Js::Phases::IsEnabled(oppositePhase,phase), !bVar2)) {
        oppositeRange = (Range *)0x0;
      }
      else {
        oppositeRange = Js::Phases::GetRange(oppositePhase,phase);
      }
      pRange = Js::Phases::GetRange(pPhaseList,phase);
      ParseRange(this,pRange,oppositeRange);
      return;
    }
    if (oppositePhase != (Phases *)0x0) {
      Js::Phases::Disable(oppositePhase,phase);
    }
    this_00 = (SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
               *)Js::Phases::GetRange(pPhaseList,phase);
    SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>::Clear
              (this_00);
    return;
  }
  this->pszCurrentArg = pWVar1 + 1;
  if (oppositePhase != (Phases *)0x0) {
    Js::Phases::Disable(oppositePhase,phase);
  }
  ParsePhase(this,pPhaseList,oppositePhase);
  return;
}

Assistant:

void
CmdLineArgsParser::ParsePhase(Js::Phases *pPhaseList, Js::Phases *oppositePhase)
{
    char16 buffer[MaxTokenSize];
    ZeroMemory(buffer, sizeof(buffer));

    Phase phase = ConfigFlagsTable::GetPhase(ParseString(buffer));
    if(InvalidPhase == phase)
    {
        throw Exception(_u("Invalid phase :"));
    }

    pPhaseList->Enable(phase);
    switch(CurChar())
    {
    case ':':
    {
        NextChar();
        Js::Range* oppositeRange = nullptr;
        if (oppositePhase && oppositePhase->IsEnabled(phase))
        {
            oppositeRange = oppositePhase->GetRange(phase);
        }
        ParseRange(pPhaseList->GetRange(phase), oppositeRange);
        break;
    }
    case ',':
        NextChar();
        if (oppositePhase)
        {
            // The whole phase is turned on/off so disable the opposite
            oppositePhase->Disable(phase);
        }
        ParsePhase(pPhaseList, oppositePhase);
        break;
    default:
        if (oppositePhase)
        {
            // The whole phase is turned on/off so disable the opposite
            oppositePhase->Disable(phase);
        }
        pPhaseList->GetRange(phase)->Clear();
        break;
    }
}